

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHBuildNode * __thiscall
pbrt::BVHAggregate::emitLBVH
          (BVHAggregate *this,BVHBuildNode **buildNodes,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          MortonPrimitive *mortonPrims,int nPrimitives,int *totalNodes,
          vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *orderedPrims,
          atomic<int> *orderedPrimsOffset,int bitIndex)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint line;
  size_t sVar5;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *in_RCX;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *in_RDX;
  BVHAggregate *in_RSI;
  int *in_RDI;
  uint in_R8D;
  int *in_R9;
  vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *unaff_retaddr;
  vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  int axis;
  BVHBuildNode *lbvh [2];
  BVHBuildNode *node_1;
  uint32_t vb_2;
  uint32_t va_2;
  int vb_1;
  int va_1;
  int splitOffset;
  int mask;
  int primitiveIndex;
  int i;
  int firstPrimOffset;
  Bounds3f bounds;
  BVHBuildNode *node;
  int vb;
  int va;
  Primitive *in_stack_fffffffffffffec8;
  Primitive *in_stack_fffffffffffffed0;
  BVHBuildNode *in_stack_fffffffffffffee8;
  BVHBuildNode *in_stack_fffffffffffffef0;
  anon_class_16_2_d9d0e799 *in_stack_fffffffffffffef8;
  int axis_00;
  BVHBuildNode *in_stack_ffffffffffffff00;
  char (*in_stack_ffffffffffffff18) [43];
  char (*in_stack_ffffffffffffff20) [47];
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  LogLevel level;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uStack_90;
  int local_88;
  Bounds3<float> *in_stack_ffffffffffffff88;
  Bounds3<float> *in_stack_ffffffffffffff90;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar7;
  BVHBuildNode *local_28;
  
  uVar6 = 0;
  if ((int)in_R8D < 1) {
    LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],int&,char_const(&)[2],int&>
              ((LogLevel)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
               (char (*) [12])in_stack_ffffffffffffff20,(char (*) [2])in_stack_ffffffffffffff18,
               (char (*) [12])CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (char (*) [2])CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if ((in_stack_00000018 == -1) || ((int)in_R8D < *in_RDI)) {
    *in_R9 = *in_R9 + 1;
    local_28 = *(BVHBuildNode **)in_RSI;
    *(BVHBuildNode **)in_RSI = local_28 + 1;
    Bounds3<float>::Bounds3(&in_stack_fffffffffffffef0->bounds);
    piVar1 = (int *)CONCAT44(in_stack_00000014,in_stack_00000010);
    LOCK();
    iVar3 = *piVar1;
    *piVar1 = *piVar1 + in_R8D;
    UNLOCK();
    for (local_88 = 0; local_88 < (int)in_R8D; local_88 = local_88 + 1) {
      iVar4 = *(int *)(&(in_RCX->
                        super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)
                        ._M_impl.super__Vector_impl_data._M_start + local_88);
      std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)(in_RDI + 2),
                 (long)iVar4);
      std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                (in_stack_00000008,(long)(iVar3 + local_88));
      Primitive::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::operator[]
                (in_RDX,(long)iVar4);
      Union<float>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff88 =
           (Bounds3<float> *)CONCAT44(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      in_stack_ffffffffffffff90 = (Bounds3<float> *)CONCAT44(uStack_90,in_stack_ffffffffffffff6c);
    }
    BVHBuildNode::InitLeaf(local_28,iVar3,in_R8D,(Bounds3f *)&stack0xffffffffffffff80);
  }
  else {
    uVar2 = 1 << ((byte)in_stack_00000018 & 0x1f);
    if ((*(uint *)((long)&(in_RCX->
                          super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4) & uVar2) ==
        (*(uint *)((long)&(in_RCX->
                          super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                          )._M_impl.super__Vector_impl_data._M_start +
                  (long)(int)(in_R8D - 1) * 8 + 4) & uVar2)) {
      local_28 = emitLBVH(in_RSI,(BVHBuildNode **)in_RDX,in_RCX,
                          (MortonPrimitive *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),
                          (int)((ulong)in_R9 >> 0x20),(int *)((ulong)in_R8D << 0x20),unaff_retaddr,
                          (atomic<int> *)in_stack_00000008,in_stack_00000010);
    }
    else {
      level = (LogLevel)((ulong)&stack0xffffffffffffffb8 >> 0x20);
      uVar7 = in_R8D;
      sVar5 = FindInterval<pbrt::BVHAggregate::emitLBVH(pbrt::BVHBuildNode*&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,pbrt::MortonPrimitive*,int,int*,std::vector<pbrt::Primitive,std::allocator<pbrt::Primitive>>&,std::atomic<int>*,int)::__0>
                        ((size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      axis_00 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      iVar3 = (int)sVar5 + 1;
      iVar4 = uVar7 - 1;
      if (iVar4 < iVar3) {
        LogFatal<char_const(&)[12],char_const(&)[16],char_const(&)[12],int&,char_const(&)[16],int&>
                  (level,(char *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffff34,
                   in_stack_ffffffffffffff28,(char (*) [12])in_stack_ffffffffffffff20,
                   (char (*) [16])in_stack_ffffffffffffff18,
                   (char (*) [12])CONCAT44(iVar3,in_stack_ffffffffffffff50),
                   (int *)CONCAT44(in_stack_ffffffffffffff5c,uVar2),
                   (char (*) [16])CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      line = *(uint *)((long)&(in_RCX->
                              super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                              )._M_impl.super__Vector_impl_data._M_start + (long)(int)sVar5 * 8 + 4)
             & uVar2;
      if (line == (*(uint *)((long)&(in_RCX->
                                    super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)iVar3 * 8 + 4
                            ) & uVar2)) {
        LogFatal<char_const(&)[47],char_const(&)[43],char_const(&)[47],unsigned_int&,char_const(&)[43],unsigned_int&>
                  (level,(char *)CONCAT44(iVar3,iVar4),line,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (char (*) [47])CONCAT44(iVar3,in_stack_ffffffffffffff50),
                   (uint *)CONCAT44(in_stack_ffffffffffffff5c,uVar2),
                   (char (*) [43])CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (uint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      *in_R9 = *in_R9 + 1;
      local_28 = *(BVHBuildNode **)in_RSI;
      *(BVHBuildNode **)in_RSI = local_28 + 1;
      emitLBVH(in_RSI,(BVHBuildNode **)in_RDX,in_RCX,
               (MortonPrimitive *)CONCAT44(uVar7,in_stack_ffffffffffffffb0),
               (int)((ulong)in_R9 >> 0x20),(int *)CONCAT44(in_R8D,uVar6),unaff_retaddr,
               (atomic<int> *)in_stack_00000008,in_stack_00000010);
      emitLBVH(in_RSI,(BVHBuildNode **)in_RDX,in_RCX,
               (MortonPrimitive *)CONCAT44(uVar7,in_stack_ffffffffffffffb0),
               (int)((ulong)in_R9 >> 0x20),(int *)CONCAT44(in_R8D,uVar6),unaff_retaddr,
               (atomic<int> *)in_stack_00000008,in_stack_00000010);
      BVHBuildNode::InitInterior
                (in_stack_ffffffffffffff00,axis_00,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
    }
  }
  return local_28;
}

Assistant:

BVHBuildNode *BVHAggregate::emitLBVH(BVHBuildNode *&buildNodes,
                                     const std::vector<BVHPrimitive> &bvhPrimitives,
                                     MortonPrimitive *mortonPrims, int nPrimitives,
                                     int *totalNodes,
                                     std::vector<Primitive> &orderedPrims,
                                     std::atomic<int> *orderedPrimsOffset, int bitIndex) {
    CHECK_GT(nPrimitives, 0);
    if (bitIndex == -1 || nPrimitives < maxPrimsInNode) {
        // Create and return leaf node of LBVH treelet
        ++*totalNodes;
        BVHBuildNode *node = buildNodes++;
        Bounds3f bounds;
        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
        for (int i = 0; i < nPrimitives; ++i) {
            int primitiveIndex = mortonPrims[i].primitiveIndex;
            orderedPrims[firstPrimOffset + i] = primitives[primitiveIndex];
            bounds = Union(bounds, bvhPrimitives[primitiveIndex].bounds);
        }
        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
        return node;

    } else {
        int mask = 1 << bitIndex;
        // Advance to next subtree level if there is no LBVH split for this bit
        if ((mortonPrims[0].mortonCode & mask) ==
            (mortonPrims[nPrimitives - 1].mortonCode & mask))
            return emitLBVH(buildNodes, bvhPrimitives, mortonPrims, nPrimitives,
                            totalNodes, orderedPrims, orderedPrimsOffset, bitIndex - 1);

        // Find LBVH split point for this dimension
        int splitOffset = FindInterval(nPrimitives, [&](int index) {
            return ((mortonPrims[0].mortonCode & mask) ==
                    (mortonPrims[index].mortonCode & mask));
        });
        ++splitOffset;
        CHECK_LE(splitOffset, nPrimitives - 1);
        CHECK_NE(mortonPrims[splitOffset - 1].mortonCode & mask,
                 mortonPrims[splitOffset].mortonCode & mask);

        // Create and return interior LBVH node
        (*totalNodes)++;
        BVHBuildNode *node = buildNodes++;
        BVHBuildNode *lbvh[2] = {
            emitLBVH(buildNodes, bvhPrimitives, mortonPrims, splitOffset, totalNodes,
                     orderedPrims, orderedPrimsOffset, bitIndex - 1),
            emitLBVH(buildNodes, bvhPrimitives, &mortonPrims[splitOffset],
                     nPrimitives - splitOffset, totalNodes, orderedPrims,
                     orderedPrimsOffset, bitIndex - 1)};
        int axis = bitIndex % 3;
        node->InitInterior(axis, lbvh[0], lbvh[1]);
        return node;
    }
}